

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaInvPnd.cpp
# Opt level: O0

void __thiscall NaInvPend::Function(NaInvPend *this,NaReal *u,NaReal *y)

{
  int j;
  int i;
  NaReal yp [4];
  NaReal *y_local;
  NaReal *u_local;
  NaInvPend *this_local;
  
  yp[0] = this->x[0];
  yp[1] = this->x[1];
  yp[2] = this->q[0];
  yp[3] = this->q[1];
  for (i = 0; i < 4; i = i + 1) {
    y[i] = *u * this->B[i];
    for (j = 0; j < 4; j = j + 1) {
      y[i] = this->A[i][j] * yp[j] + y[i];
    }
  }
  this->x[0] = *y;
  this->x[1] = y[1];
  this->q[0] = y[2];
  this->q[1] = y[3];
  return;
}

Assistant:

void
NaInvPend::Function (NaReal* u, NaReal* y)
{
  NaReal	yp[4];	/* previous state */

  yp[0] = x[0];
  yp[1] = x[1];
  yp[2] = q[0];
  yp[3] = q[1];

  for(int i = 0; i < 4; ++i)
    {
      y[i] = u[0] * B[i];
      for(int j = 0; j < 4; ++j)
	{
	  y[i] += A[i][j] * yp[j];
	}
    }

  x[0] = y[0];
  x[1] = y[1];
  q[0] = y[2];
  q[1] = y[3];
}